

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QControlledGate2<float>::QControlledGate2
          (QControlledGate2<float> *this,int control,int controlState)

{
  bool local_21;
  int controlState_local;
  int control_local;
  QControlledGate2<float> *this_local;
  
  QGate2<float>::QGate2(&this->super_QGate2<float>);
  (this->super_QGate2<float>).super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0014e398;
  this->control_ = control;
  this->controlState_ = controlState;
  if (control < 0) {
    __assert_fail("control >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                  ,0x22,
                  "qclab::qgates::QControlledGate2<float>::QControlledGate2(const int, const int) [T = float]"
                 );
  }
  local_21 = 1 < (uint)controlState;
  if (local_21) {
    __assert_fail("( controlState == 0 ) || ( controlState == 1 )",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                  ,0x23,
                  "qclab::qgates::QControlledGate2<float>::QControlledGate2(const int, const int) [T = float]"
                 );
  }
  return;
}

Assistant:

QControlledGate2( const int control , const int controlState = 1 )
        : control_( control )
        , controlState_( controlState )
        {
          assert( control >= 0 ) ;
          assert( ( controlState == 0 ) || ( controlState == 1 ) ) ;
        }